

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# liveness.c
# Opt level: O3

int getPoIndex(Aig_Man_t *pAig,Aig_Obj_t *pPivot)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  
  if (0 < (long)pAig->nTruePos) {
    uVar1 = pAig->vCos->nSize;
    uVar2 = 0;
    uVar3 = (ulong)uVar1;
    if ((int)uVar1 < 1) {
      uVar3 = uVar2;
    }
    do {
      if (uVar3 == uVar2) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      if ((Aig_Obj_t *)pAig->vCos->pArray[uVar2] == pPivot) {
        return (int)uVar2;
      }
      uVar2 = uVar2 + 1;
    } while ((long)pAig->nTruePos != uVar2);
  }
  return -1;
}

Assistant:

int getPoIndex( Aig_Man_t *pAig, Aig_Obj_t *pPivot )
{
	int i;
	Aig_Obj_t *pObj;

	Saig_ManForEachPo( pAig, pObj, i )
	{
		if( pObj == pPivot )
			return i;
	}
	return -1;
}